

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O1

void prng_read(prng *pr,void *vout,size_t size)

{
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr **pp_Var1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var3;
  uint i;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uchar buf [114];
  undefined1 auStack_a8 [120];
  
  if (pr[2].savesize != 0) {
    __assert_fail("!pi->keymaker",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xdd,"void prng_read(prng *, void *, size_t)");
  }
  if (size != 0) {
    do {
      p_Var3 = pr[1].binarysink_[0].write;
      plVar4 = (long *)(*(code *)**(undefined8 **)p_Var3)();
      (**(code **)(*plVar4 + 0x10))(plVar4,p_Var3);
      BinarySink_put_byte((BinarySink *)plVar4[1],'G');
      uVar7 = 0xfffffff8;
      do {
        uVar7 = uVar7 + 8;
        BinarySink_put_byte((BinarySink *)plVar4[1],
                            (uchar)((ulong)(&pr[1].binarysink_[0].writefmtv)[uVar7 >> 6] >>
                                   ((byte)uVar7 & 0x38)));
      } while (uVar7 < 0x78);
      uVar6 = 1;
      lVar5 = 0;
      do {
        pp_Var1 = &pr[1].binarysink_[0].writefmtv + lVar5;
        p_Var2 = *pp_Var1;
        *pp_Var1 = *pp_Var1 + uVar6;
        uVar6 = (ulong)CARRY8((ulong)p_Var2,uVar6);
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      (**(code **)(*plVar4 + 0x18))(plVar4,auStack_a8);
      (**(code **)(*plVar4 + 0x20))(plVar4);
      uVar6 = *(ulong *)(pr[1].savesize + 0x28);
      if (size < uVar6) {
        uVar6 = size;
      }
      memcpy(vout,auStack_a8,uVar6);
      vout = (void *)((long)vout + uVar6);
      size = size - uVar6;
    } while (size != 0);
  }
  smemclr(auStack_a8,0x72);
  prng_seed_begin(pr);
  prng_seed_finish(pr);
  return;
}

Assistant:

void prng_read(prng *pr, void *vout, size_t size)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);
    unsigned char buf[MAX_HASH_LEN];

    assert(!pi->keymaker);

    prngdebug("prng_read %"SIZEu"\n", size);

    uint8_t *out = (uint8_t *)vout;
    while (size > 0) {
        prng_generate(pi, buf);
        size_t to_use = size > pi->hashalg->hlen ? pi->hashalg->hlen : size;
        memcpy(out, buf, to_use);
        out += to_use;
        size -= to_use;
    }

    smemclr(buf, sizeof(buf));

    prng_seed_begin(&pi->Prng);
    prng_seed_finish(&pi->Prng);
}